

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

exr_result_t validate_channels(exr_context_t f,exr_priv_part_t curpart)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  exr_result_t eVar5;
  long lVar6;
  long lVar7;
  long in_RSI;
  long in_RDI;
  int32_t ysamp;
  int32_t xsamp;
  int c;
  exr_attr_chlist_t *channels;
  int64_t h;
  int64_t w;
  exr_attr_box2i_t dw;
  int local_44;
  int local_28;
  int iStack_24;
  int local_20;
  int iStack_1c;
  exr_result_t local_4;
  
  if (*(long *)(in_RSI + 0x20) == 0) {
    local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"\'channels\' attribute not found");
  }
  else if (*(int *)(*(long *)(in_RSI + 0x20) + 0x14) == 3) {
    piVar3 = *(int **)(*(long *)(in_RSI + 0x20) + 0x18);
    if (*(long *)(in_RSI + 0x30) == 0) {
      local_4 = (**(code **)(in_RDI + 0x40))
                          (in_RDI,0xf,
                           "request to validate channel list, but data window not set to validate against"
                          );
    }
    else if (*piVar3 < 1) {
      local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,6,"At least one channel required");
    }
    else {
      uVar4 = *(ulong *)(in_RSI + 0x90);
      local_20 = (int)*(undefined8 *)(in_RSI + 0x98);
      local_28 = (int)uVar4;
      lVar6 = ((long)local_20 - (long)local_28) + 1;
      iStack_1c = (int)((ulong)*(undefined8 *)(in_RSI + 0x98) >> 0x20);
      iStack_24 = (int)(uVar4 >> 0x20);
      lVar7 = ((long)iStack_1c - (long)iStack_24) + 1;
      for (local_44 = 0; local_44 < *piVar3; local_44 = local_44 + 1) {
        iVar1 = *(int *)(*(long *)(piVar3 + 2) + (long)local_44 * 0x20 + 0x18);
        iVar2 = *(int *)(*(long *)(piVar3 + 2) + (long)local_44 * 0x20 + 0x1c);
        if (iVar1 < 1) {
          eVar5 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xe,"channel \'%s\': x subsampling factor is invalid (%d)",
                             *(undefined8 *)(*(long *)(piVar3 + 2) + (long)local_44 * 0x20 + 8),
                             iVar1);
          return eVar5;
        }
        if (iVar2 < 1) {
          eVar5 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xe,"channel \'%s\': y subsampling factor is invalid (%d)",
                             *(undefined8 *)(*(long *)(piVar3 + 2) + (long)local_44 * 0x20 + 8),
                             iVar2);
          return eVar5;
        }
        if (local_28 % iVar1 != 0) {
          eVar5 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xe,
                             "channel \'%s\': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)"
                             ,*(undefined8 *)(*(long *)(piVar3 + 2) + (long)local_44 * 0x20 + 8),
                             uVar4 & 0xffffffff,iVar1);
          return eVar5;
        }
        if (iStack_24 % iVar2 != 0) {
          eVar5 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xe,
                             "channel \'%s\': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)"
                             ,*(undefined8 *)(*(long *)(piVar3 + 2) + (long)local_44 * 0x20 + 8),
                             iStack_24,iVar2);
          return eVar5;
        }
        if (lVar6 % (long)iVar1 != 0) {
          eVar5 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xe,
                             "channel \'%s\': row width (%ld) of the data window is not a multiple of the x subsampling factor (%d)"
                             ,*(undefined8 *)(*(long *)(piVar3 + 2) + (long)local_44 * 0x20 + 8),
                             lVar6,iVar1);
          return eVar5;
        }
        if (lVar7 % (long)iVar2 != 0) {
          eVar5 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xe,
                             "channel \'%s\': column height (%ld) of the data window is not a multiple of the y subsampling factor (%d)"
                             ,*(undefined8 *)(*(long *)(piVar3 + 2) + (long)local_44 * 0x20 + 8),
                             lVar7,iVar2);
          return eVar5;
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0x10,"\'channels\' attribute has wrong data type, expect chlist");
  }
  return local_4;
}

Assistant:

static exr_result_t
validate_channels (
    exr_context_t f, exr_priv_part_t curpart)
{
    exr_attr_box2i_t         dw;
    int64_t                  w, h;
    const exr_attr_chlist_t* channels;

    if (!curpart->channels)
        return f->print_error (
            f, EXR_ERR_MISSING_REQ_ATTR, "'channels' attribute not found");
    else if (curpart->channels->type != EXR_ATTR_CHLIST)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'channels' attribute has wrong data type, expect chlist");

    channels = curpart->channels->chlist;

    if (!curpart->dataWindow)
        return f->report_error (
            f,
            EXR_ERR_NO_ATTR_BY_NAME,
            "request to validate channel list, but data window not set to validate against");

    if (channels->num_channels <= 0)
        return f->report_error (
            f, EXR_ERR_FILE_BAD_HEADER, "At least one channel required");

    dw = curpart->data_window;
    w  = (int64_t) dw.max.x - (int64_t) dw.min.x + 1;
    h  = (int64_t) dw.max.y - (int64_t) dw.min.y + 1;

    for (int c = 0; c < channels->num_channels; ++c)
    {
        int32_t xsamp = channels->entries[c].x_sampling;
        int32_t ysamp = channels->entries[c].y_sampling;

        if (xsamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': x subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                xsamp);
        if (ysamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': y subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                ysamp);
        if (dw.min.x % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.x,
                xsamp);
        if (dw.min.y % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.y,
                ysamp);
        if (w % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': row width (%" PRId64
                ") of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                w,
                xsamp);
        if (h % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': column height (%" PRId64
                ") of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                h,
                ysamp);
    }

    return EXR_ERR_SUCCESS;
}